

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void anon_unknown.dwarf_816508::CheckINTERFACE_LINK_LIBRARIES(string *value,cmMakefile *context)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream e;
  cmMakefile *context_local;
  string *value_local;
  
  if (((anonymous_namespace)::CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)
       ::keys == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)
                                   ::keys), iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&CheckINTERFACE_LINK_LIBRARIES::keys,"(^|;)(debug|optimized|general)(;|$)");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&CheckINTERFACE_LINK_LIBRARIES::keys,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::
                         keys);
  }
  bVar1 = cmsys::RegularExpression::find(&CheckINTERFACE_LINK_LIBRARIES::keys,value);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = std::operator<<((ostream *)local_1a0,
                             "Property INTERFACE_LINK_LIBRARIES may not contain link-type keyword \""
                            );
    cmsys::RegularExpression::match_abi_cxx11_(&local_1c0,&CheckINTERFACE_LINK_LIBRARIES::keys,2);
    poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
    std::operator<<(poVar3,
                    "\".  The INTERFACE_LINK_LIBRARIES property may contain configuration-sensitive generator-expressions which may be used to specify per-configuration rules."
                   );
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return;
}

Assistant:

void CheckINTERFACE_LINK_LIBRARIES(const std::string& value,
                                   cmMakefile* context)
{
  // Look for link-type keywords in the value.
  static cmsys::RegularExpression keys("(^|;)(debug|optimized|general)(;|$)");
  if (keys.find(value)) {
    // Report an error.
    std::ostringstream e;

    e << "Property INTERFACE_LINK_LIBRARIES may not contain link-type "
         "keyword \""
      << keys.match(2)
      << "\".  The INTERFACE_LINK_LIBRARIES "
         "property may contain configuration-sensitive generator-expressions "
         "which may be used to specify per-configuration rules.";

    context->IssueMessage(MessageType::FATAL_ERROR, e.str());
  }
}